

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

bool __thiscall MyClient::Initialize(MyClient *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SDKConnection *sdkConnection;
  OutputWorker *pOVar2;
  TonkResult TVar3;
  shared_ptr<MyClientConnection> connPtr;
  SDKJsonResult result;
  string local_1f8;
  SDKConnection *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  size_type local_1b8;
  char local_1b0 [16];
  undefined1 local_1a0 [8];
  Level local_198;
  undefined4 uStack_194;
  ostringstream local_190 [8];
  undefined1 local_188 [104];
  ios_base local_120 [264];
  
  (this->super_SDKSocket).Config.UDPListenPort = 0;
  (this->super_SDKSocket).Config.MaximumClients = 10;
  (this->super_SDKSocket).Config.BandwidthLimitBPS = 4000000;
  (this->super_SDKSocket).Config.Flags = 6;
  tonk::SDKSocket::Create((SDKJsonResult *)local_1c8,&this->super_SDKSocket);
  if (local_1c8._0_4_ == Tonk_Success) {
    local_1a0 = (undefined1  [8])this;
    std::__shared_ptr<MyClientConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<MyClientConnection>,MyClient*>
              ((__shared_ptr<MyClientConnection,(__gnu_cxx::_Lock_policy)2> *)&local_1d8,
               (allocator<MyClientConnection> *)&local_1f8,(MyClient **)local_1a0);
    test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_connect);
    sdkConnection = local_1d8;
    paVar1 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"localhost","");
    tonk::SDKSocket::Connect
              ((SDKJsonResult *)local_1a0,&this->super_SDKSocket,sdkConnection,&local_1f8,0x13c4);
    local_1c8._0_4_ = local_1a0._0_4_;
    std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_198);
    if ((undefined1 *)CONCAT44(uStack_194,local_198) != local_188) {
      operator_delete((undefined1 *)CONCAT44(uStack_194,local_198));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_connect);
    if (local_1c8._0_4_ == Tonk_Success) {
      test::SendPreconnectData(local_1d8);
    }
    else {
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_1c0._M_p,local_1c0._M_p + local_1b8);
      if ((int)Logger.ChannelMinLevel < 5) {
        local_1a0 = (undefined1  [8])Logger.ChannelName;
        local_198 = Error;
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,Logger.Prefix._M_dataplus._M_p,
                   Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Unable to connect: ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream(local_190);
        std::ios_base::~ios_base(local_120);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
    }
    TVar3 = local_1c8._0_4_;
    if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
    }
  }
  else {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_1c0._M_p,local_1c0._M_p + local_1b8);
    if ((int)Logger.ChannelMinLevel < 5) {
      local_1a0 = (undefined1  [8])Logger.ChannelName;
      local_198 = Error;
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Unable to create socket: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
    }
    TVar3 = local_1c8._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
      TVar3 = local_1c8._0_4_;
    }
  }
  if (local_1c0._M_p != local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  return TVar3 == Tonk_Success;
}

Assistant:

bool MyClient::Initialize()
{
    // Set configuration
    Config.UDPListenPort = 0;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    Config.Flags |= TONK_FLAGS_DISABLE_COMPRESSION;
    Config.BandwidthLimitBPS = 4000000;

    tonk::SDKJsonResult result = Create();
    if (!result)
    {
        Logger.Error("Unable to create socket: ", result.ToString());
        return result;
    }

    auto connPtr = std::make_shared<MyClientConnection>(this);

    t_tonk_connect.BeginCall();
    result = Connect(
        connPtr.get(),
        TONK_TEST_SERVER_IP,
        kUDPServerPort_Client);
    t_tonk_connect.EndCall();

    if (!result) {
        Logger.Error("Unable to connect: ", result.ToString());
    }
    else {
        SendPreconnectData(connPtr.get());
    }

    return result;
}